

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::optimize(xpath_ast_node *this,xpath_allocator *alloc)

{
  byte bVar1;
  xpath_ast_node *pxVar2;
  xpath_ast_node *pxVar3;
  bool bVar4;
  long lVar5;
  undefined1 (*pauVar6) [64];
  char cVar7;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  byte bVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  
  if (this->_left != (xpath_ast_node *)0x0) {
    optimize(this->_left,alloc);
  }
  if (this->_right != (xpath_ast_node *)0x0) {
    optimize(this->_right,alloc);
  }
  if (this->_next != (xpath_ast_node *)0x0) {
    optimize(this->_next,alloc);
  }
  bVar1 = this->_type;
  if ((bVar1 & 0xfe) != 0x10) goto LAB_0010c1a1;
  pxVar2 = this->_right;
  if ((((pxVar2 != (xpath_ast_node *)0x0) && (pxVar2->_type == '\x03')) &&
      (pxVar2->_left->_type == '\x16')) && (pxVar2->_right->_rettype == '\x02')) {
    this->_right = pxVar2->_right;
  }
  pxVar2 = this->_right;
  if (pxVar2 == (xpath_ast_node *)0x0) goto LAB_0010c1a1;
  if (this->_test != '\0') {
    __assert_fail("_test == predicate_default",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x2afa,
                  "void pugi::impl::(anonymous namespace)::xpath_ast_node::optimize_self(xpath_allocator *)"
                 );
  }
  if (pxVar2->_type == '\x13') {
    cVar7 = '\x03';
    if (((pxVar2->_data).number != 1.0) || (NAN((pxVar2->_data).number))) goto LAB_0010c182;
  }
  else {
LAB_0010c182:
    cVar7 = '\x02';
    if (2 < (byte)(pxVar2->_type - 0x13U) || pxVar2->_rettype != '\x02') {
      if (pxVar2->_rettype == '\x02') goto LAB_0010c1a1;
      bVar4 = is_posinv_expr(pxVar2);
      cVar7 = '\x01';
      if (!bVar4) goto LAB_0010c1a1;
    }
  }
  this->_test = cVar7;
LAB_0010c1a1:
  if (((((bVar1 == 0x38) && ((byte)this->_axis < 0xd)) &&
       (((0x1038U >> ((byte)this->_axis & 0x1f) & 1) != 0 &&
        (((pxVar2 = this->_left, pxVar2 != (xpath_ast_node *)0x0 && (pxVar2->_type == '8')) &&
         (pxVar2->_axis == '\x05')))))) &&
      ((pxVar2->_test == '\x02' && (pxVar2->_right == (xpath_ast_node *)0x0)))) &&
     (bVar4 = is_posinv_step(this), bVar4)) {
    this->_axis = (byte)(this->_axis - 3U) < 2 ^ 5;
    this->_left = this->_left->_left;
  }
  if (((this->_type != ',') || (pxVar2 = this->_right, pxVar2 == (xpath_ast_node *)0x0)) ||
     ((pxVar2->_type != '\x12' || (pxVar2->_next->_type != '\x12')))) {
LAB_0010c32d:
    if (((((this->_type == '\x03') && (pxVar2 = this->_left, pxVar2 != (xpath_ast_node *)0x0)) &&
         (pxVar3 = this->_right, pxVar3 != (xpath_ast_node *)0x0)) &&
        ((pxVar2->_type == '8' && (pxVar2->_axis == '\x02')))) &&
       (((pxVar2->_test == '\x01' &&
         ((pxVar2->_left == (xpath_ast_node *)0x0 && (pxVar2->_right == (xpath_ast_node *)0x0)))) &&
        ((pxVar3->_type == '\x12' || ((pxVar3->_type == '\x14' && (pxVar3->_rettype == '\x03')))))))
       ) {
      this->_type = ';';
    }
    return;
  }
  pbVar8 = (pxVar2->_data).string;
  pbVar9 = (pxVar2->_next->_data).string;
  local_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  uStack_38 = 0;
  uStack_30 = 0;
  uStack_28 = 0;
  uStack_20 = 0;
  local_98 = 0;
  uStack_90 = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  uStack_78 = 0;
  uStack_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  pauVar6 = (undefined1 (*) [64])0x0;
  while( true ) {
    uVar10 = (ulong)*pbVar8;
    if (uVar10 == 0) break;
    bVar1 = *pbVar9;
    bVar4 = -1 < (char)(*pbVar8 | bVar1);
    if (bVar4) {
      if (*(char *)((long)&local_98 + uVar10) == '\0') {
        bVar11 = bVar1;
        if (bVar1 == 0) {
          bVar11 = 0x80;
        }
        *(byte *)((long)&local_98 + uVar10) = bVar11;
      }
      pbVar8 = pbVar8 + 1;
      pbVar9 = pbVar9 + (bVar1 != 0);
    }
    if (!bVar4) goto LAB_0010c321;
  }
  auVar12 = vmovdqa64_avx512f(_DAT_00118140);
  lVar5 = 0;
  auVar13 = vpbroadcastb_avx512bw(ZEXT116(0x40));
  do {
    auVar14 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)&local_98 + lVar5));
    vptestnmb_avx512f(auVar14,auVar14);
    auVar14 = vmovdqu8_avx512bw(auVar12);
    *(undefined1 (*) [64])((long)&local_98 + lVar5) = auVar14;
    lVar5 = lVar5 + 0x40;
    auVar12 = vpaddb_avx512bw(auVar12,auVar13);
  } while (lVar5 != 0x80);
  pauVar6 = (undefined1 (*) [64])xpath_allocator::allocate(alloc,0x80);
  if (pauVar6 == (undefined1 (*) [64])0x0) {
    pauVar6 = (undefined1 (*) [64])0x0;
  }
  else {
    auVar12._8_8_ = uStack_90;
    auVar12._0_8_ = local_98;
    auVar12._16_8_ = uStack_88;
    auVar12._24_8_ = uStack_80;
    auVar12._32_8_ = uStack_78;
    auVar12._40_8_ = uStack_70;
    auVar12._48_8_ = uStack_68;
    auVar12._56_8_ = uStack_60;
    auVar14 = vmovdqu64_avx512f(auVar12);
    auVar13._8_8_ = uStack_50;
    auVar13._0_8_ = local_58;
    auVar13._16_8_ = uStack_48;
    auVar13._24_8_ = uStack_40;
    auVar13._32_8_ = uStack_38;
    auVar13._40_8_ = uStack_30;
    auVar13._48_8_ = uStack_28;
    auVar13._56_8_ = uStack_20;
    auVar12 = vmovdqu64_avx512f(auVar13);
    auVar12 = vmovdqu64_avx512f(auVar12);
    pauVar6[1] = auVar12;
    auVar12 = vmovdqu64_avx512f(auVar14);
    *pauVar6 = auVar12;
  }
LAB_0010c321:
  if (pauVar6 != (undefined1 (*) [64])0x0) {
    this->_type = ':';
    (this->_data).string = (char_t *)pauVar6;
  }
  goto LAB_0010c32d;
}

Assistant:

void optimize(xpath_allocator* alloc)
		{
			if (_left)
				_left->optimize(alloc);

			if (_right)
				_right->optimize(alloc);

			if (_next)
				_next->optimize(alloc);

			// coverity[var_deref_model]
			optimize_self(alloc);
		}